

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O0

void Handlers::Talk_Msg(Character *character,PacketReader *reader)

{
  short sVar1;
  long lVar2;
  World *this;
  PacketReader *from;
  int iVar3;
  time_t tVar4;
  mapped_type *pmVar5;
  string local_b8;
  allocator<char> local_91;
  key_type local_90;
  undefined1 local_70 [8];
  string message;
  allocator<char> local_39;
  key_type local_38;
  PacketReader *local_18;
  PacketReader *reader_local;
  Character *character_local;
  
  iVar3 = character->muted_until;
  local_18 = reader;
  reader_local = (PacketReader *)character;
  tVar4 = time((time_t *)0x0);
  if (iVar3 <= tVar4) {
    sVar1 = *(short *)((long)&reader_local[4].data.field_2 + 0xe);
    lVar2 = *(long *)&reader_local[0x1a].data;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"JailMap",&local_39);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           *)(lVar2 + 0x198),&local_38);
    iVar3 = util::variant::operator_cast_to_int(pmVar5);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    if (sVar1 != iVar3) {
      PacketReader::GetEndString_abi_cxx11_((string *)local_70,local_18);
      lVar2 = *(long *)&reader_local[0x1a].data;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"ChatLength",&local_91)
      ;
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)(lVar2 + 0x198),&local_90);
      iVar3 = util::variant::operator_cast_to_int(pmVar5);
      limit_message((string *)local_70,(long)iVar3);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      from = reader_local;
      this = *(World **)&reader_local[0x1a].data;
      std::__cxx11::string::string((string *)&local_b8,(string *)local_70);
      World::Msg(this,(Command_Source *)from,&local_b8,false);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

void Talk_Msg(Character *character, PacketReader &reader)
{
	if (character->muted_until > time(0)) return;

	if (character->mapid == static_cast<int>(character->world->config["JailMap"]))
	{
		return;
	}

	std::string message = reader.GetEndString();
	limit_message(message, static_cast<int>(character->world->config["ChatLength"]));

	character->world->Msg(character, message, false);
}